

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateActivation
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  LayerUnion LVar4;
  Result *_result;
  string local_90;
  string local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar3) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar3 = Result::good(__return_storage_ptr__);
      if (bVar3) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar3) {
          if (this->ndArrayInterpretation == true) {
            if (layer->_oneof_case_[0] == 0x82) {
              LVar4 = layer->layer_;
            }
            else {
              LVar4.activation_ = Specification::ActivationParams::default_instance();
            }
            if (*(uint32 *)((long)&(LVar4.convolution_)->kernelsize_ + 0xc) == 0x19) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"ActivationPReLU","");
              validateInputOutputRankEquality
                        (__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              bVar3 = Result::good(__return_storage_ptr__);
              if (!bVar3) {
                return __return_storage_ptr__;
              }
              pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar2 != paVar1) {
                operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
              }
              if (!bVar3) {
                return __return_storage_ptr__;
              }
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,"ActivationPReLU","");
              validateRankCount(__return_storage_ptr__,layer,&local_90,3,-1,&this->blobNameToRank);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              bVar3 = Result::good(__return_storage_ptr__);
              if (!bVar3) {
                return __return_storage_ptr__;
              }
              pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar2 != paVar1) {
                operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
              }
              if (!bVar3) {
                return __return_storage_ptr__;
              }
            }
            if (layer->_oneof_case_[0] == 0x82) {
              LVar4 = layer->layer_;
            }
            else {
              LVar4.activation_ = Specification::ActivationParams::default_instance();
            }
            if (*(uint32 *)((long)&(LVar4.convolution_)->kernelsize_ + 0xc) == 0x47) {
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_70,"ActivationParametricSoftplus","");
              validateInputOutputRankEquality
                        (__return_storage_ptr__,layer,&local_70,&this->blobNameToRank);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              bVar3 = Result::good(__return_storage_ptr__);
              if (!bVar3) {
                return __return_storage_ptr__;
              }
              pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar2 != paVar1) {
                operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
              }
              if (!bVar3) {
                return __return_storage_ptr__;
              }
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,"ActivationParametricSoftplus","");
              validateRankCount(__return_storage_ptr__,layer,&local_90,3,-1,&this->blobNameToRank);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              bVar3 = Result::good(__return_storage_ptr__);
              if (!bVar3) {
                return __return_storage_ptr__;
              }
              pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar2 != paVar1) {
                operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
              }
              if (!bVar3) {
                return __return_storage_ptr__;
              }
            }
          }
          if (layer->_oneof_case_[0] == 0x82) {
            LVar4 = layer->layer_;
          }
          else {
            LVar4.activation_ = Specification::ActivationParams::default_instance();
          }
          validateActivationParams(__return_storage_ptr__,LVar4.activation_);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateActivation(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        if (layer.activation().NonlinearityType_case() == Specification::ActivationParams::NonlinearityTypeCase::kPReLU) {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ActivationPReLU", blobNameToRank));
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "ActivationPReLU", 3, -1, blobNameToRank));
        }

        if (layer.activation().NonlinearityType_case() == Specification::ActivationParams::NonlinearityTypeCase::kParametricSoftplus) {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ActivationParametricSoftplus", blobNameToRank));
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "ActivationParametricSoftplus", 3, -1, blobNameToRank));
        }
    }

    return validateActivationParams(layer.activation());
}